

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O2

boolean clear_path(int col1,int row1,int col2,int row2)

{
  boolean bVar1;
  int iVar2;
  
  if (col1 < col2) {
    if (row2 < row1) {
      iVar2 = q1_path(row1,col1,row2,col2);
      bVar1 = (boolean)iVar2;
    }
    else {
      iVar2 = q4_path(row1,col1,row2,col2);
      bVar1 = (boolean)iVar2;
    }
  }
  else if (row2 < row1) {
    iVar2 = q2_path(row1,col1,row2,col2);
    bVar1 = (boolean)iVar2;
  }
  else if (col1 == col2 && row1 == row2) {
    bVar1 = '\x01';
  }
  else {
    iVar2 = q3_path(row1,col1,row2,col2);
    bVar1 = (boolean)iVar2;
  }
  return bVar1;
}

Assistant:

boolean clear_path(int col1, int row1, int col2, int row2)
{
    int result;

    if (col1 < col2) {
	if (row1 > row2) {
	    result = q1_path(row1,col1,row2,col2);
	} else {
	    result = q4_path(row1,col1,row2,col2);
	}
    } else {
	if (row1 > row2) {
	    result = q2_path(row1,col1,row2,col2);
	} else if (row1 == row2 && col1 == col2) {
	    result = 1;
	} else {
	    result = q3_path(row1,col1,row2,col2);
	}
    }
    return (boolean)result;
}